

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnReturnCallIndirect
          (SharedValidator *this,Location *loc,Var *sig_var,Var *table_var)

{
  Result RVar1;
  Var local_108;
  Enum local_bc;
  undefined1 local_b8 [8];
  FuncType func_type;
  Opcode local_34;
  Var *local_30;
  Var *table_var_local;
  Var *sig_var_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  local_30 = table_var;
  table_var_local = sig_var;
  sig_var_local = (Var *)loc;
  loc_local = (Location *)this;
  Opcode::Opcode(&local_34,CallIndirect);
  this_local._4_4_ = CheckInstr(this,local_34,&sig_var_local->loc);
  Var::Var((Var *)&func_type.type_index,table_var);
  RVar1 = CheckTableIndex(this,(Var *)&func_type.type_index,(TableType *)0x0);
  Result::operator|=((Result *)((long)&this_local + 4),RVar1);
  Var::~Var((Var *)&func_type.type_index);
  FuncType::FuncType((FuncType *)local_b8);
  Var::Var(&local_108,sig_var);
  local_bc = (Enum)CheckFuncTypeIndex(this,&local_108,(FuncType *)local_b8);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_bc);
  Var::~Var(&local_108);
  RVar1 = TypeChecker::OnReturnCallIndirect
                    (&this->typechecker_,(TypeVector *)local_b8,
                     (TypeVector *)
                     &func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  Result::operator|=((Result *)((long)&this_local + 4),RVar1);
  FuncType::~FuncType((FuncType *)local_b8);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnReturnCallIndirect(const Location& loc,
                                             Var sig_var,
                                             Var table_var) {
  Result result = CheckInstr(Opcode::CallIndirect, loc);
  result |= CheckTableIndex(table_var);
  FuncType func_type;
  result |= CheckFuncTypeIndex(sig_var, &func_type);
  result |=
      typechecker_.OnReturnCallIndirect(func_type.params, func_type.results);
  return result;
}